

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

int Mvc_CoverIsCubeFree(Mvc_Cover_t *pCover)

{
  bool local_19;
  uint local_18;
  uint local_14;
  int _i_;
  int Result;
  Mvc_Cover_t *pCover_local;
  
  Mvc_CoverAllocateMask(pCover);
  Mvc_CoverCommonCube(pCover,pCover->pMask);
  if ((*(uint *)&pCover->pMask->field_0x8 & 0xffffff) == 0) {
    local_14 = (uint)(pCover->pMask->pData[0] == 0);
  }
  else if ((*(uint *)&pCover->pMask->field_0x8 & 0xffffff) == 1) {
    local_19 = false;
    if (pCover->pMask->pData[0] == 0) {
      local_19 = *(int *)&pCover->pMask->field_0x14 == 0;
    }
    local_14 = (uint)local_19;
  }
  else {
    local_14 = 1;
    for (local_18 = *(uint *)&pCover->pMask->field_0x8 & 0xffffff; -1 < (int)local_18;
        local_18 = local_18 - 1) {
      if (pCover->pMask->pData[(int)local_18] != 0) {
        return 0;
      }
    }
  }
  return local_14;
}

Assistant:

int Mvc_CoverIsCubeFree( Mvc_Cover_t * pCover )
{
    int Result;
    // get the common cube
    Mvc_CoverAllocateMask( pCover );
    Mvc_CoverCommonCube( pCover, pCover->pMask );
    // check whether the common cube is empty
    Mvc_CubeBitEmpty( Result, pCover->pMask );
    return Result;
}